

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O3

Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> __thiscall
capnp::SchemaFile::DiskSchemaFile::import(DiskSchemaFile *this,StringPtr target)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  Path *params_1;
  undefined1 auVar3 [16];
  String *pSVar4;
  size_t sVar5;
  undefined1 auVar6 [8];
  undefined8 uVar7;
  undefined8 uVar8;
  size_t in_RCX;
  DiskSchemaFile *extraout_RDX_00;
  DiskSchemaFile *extraout_RDX_01;
  DiskSchemaFile *pDVar9;
  DiskSchemaFile *extraout_RDX_02;
  DiskSchemaFile *extraout_RDX_03;
  DiskSchemaFile *extraout_RDX_04;
  DiskSchemaFile *extraout_RDX_05;
  DiskSchemaFile *extraout_RDX_06;
  long lVar10;
  Own<const_kj::ReadableFile,_std::nullptr_t> *newFile;
  ReadableFile *pRVar11;
  Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> OVar12;
  Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> MVar13;
  StringPtr path;
  StringPtr pathText;
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _newFile384;
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _newFile403;
  Path parsed;
  Path local_258;
  Own<const_kj::ReadableFile,_std::nullptr_t> local_238;
  char **local_228;
  undefined1 local_218 [8];
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 aStack_210;
  DiskSchemaFile *local_1f0;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  char *local_1d8 [2];
  Maybe<kj::Exception> local_1c8;
  DiskSchemaFile *extraout_RDX;
  anon_class_24_3_14160855 *func;
  
  pathText.content.ptr = (char *)target.content.size_;
  pRVar11 = (ReadableFile *)target.content.ptr;
  local_1d8[0] = pathText.content.ptr;
  if ((in_RCX == 1) || (*pathText.content.ptr != '/')) {
    _local_218 = *(ArrayPtr<const_kj::String> *)(pRVar11 + 2);
    _local_218 = (ArrayPtr<const_kj::String>)kj::PathPtr::parent((PathPtr *)local_218);
    pathText.content.size_ = in_RCX;
    kj::PathPtr::eval(&local_258,(PathPtr *)local_218,pathText);
    auVar3[0xf] = 0;
    auVar3._0_15_ = stack0xfffffffffffffde9;
    _local_218 = (ArrayPtr<const_kj::String>)(auVar3 << 8);
    if (*(char *)&pRVar11[0xc].super_FsNode._vptr_FsNode == '\x01') {
      local_228 = local_1d8;
      local_238.disposer = (Disposer *)local_218;
      local_238.ptr = pRVar11;
      kj::
      runCatchingExceptions<capnp::SchemaFile::DiskSchemaFile::import(kj::StringPtr)const::_lambda()_1_>
                (&local_1c8,(kj *)&local_238,func);
      if (local_1c8.ptr.isSet == true) {
        kj::Exception::~Exception(&local_1c8.ptr.field_1.value);
      }
    }
    pp_Var1 = pRVar11[1].super_FsNode._vptr_FsNode;
    (**(code **)(*pp_Var1 + 0x50))(&local_1e8,pp_Var1,local_258.parts.ptr,local_258.parts.size_);
    local_238.disposer = (Disposer *)CONCAT44(uStack_1e4,local_1e8);
    local_238.ptr = (ReadableFile *)CONCAT44(uStack_1dc,uStack_1e0);
    if (local_238.ptr == (ReadableFile *)0x0) {
      (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)0x0;
      this->baseDir = (ReadableDirectory *)0x0;
      pDVar9 = extraout_RDX_01;
    }
    else {
      OVar12 = kj::
               heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::Maybe<kj::String>>
                         ((kj *)&local_1e8,(ReadableDirectory *)pRVar11[1].super_FsNode._vptr_FsNode
                          ,&local_258,(ArrayPtr<const_kj::ReadableDirectory_*const> *)(pRVar11 + 5),
                          &local_238,(Maybe<kj::String> *)local_218);
      pRVar11 = local_238.ptr;
      pDVar9 = OVar12.ptr;
      *(undefined4 *)&(this->super_SchemaFile)._vptr_SchemaFile = local_1e8;
      *(undefined4 *)((long)&(this->super_SchemaFile)._vptr_SchemaFile + 4) = uStack_1e4;
      *(undefined4 *)&this->baseDir = uStack_1e0;
      *(undefined4 *)((long)&this->baseDir + 4) = uStack_1dc;
      if (local_238.ptr != (ReadableFile *)0x0) {
        local_238.ptr = (ReadableFile *)0x0;
        (**(local_238.disposer)->_vptr_Disposer)
                  (local_238.disposer,
                   (pRVar11->super_FsNode)._vptr_FsNode[-2] +
                   (long)&(pRVar11->super_FsNode)._vptr_FsNode);
        pDVar9 = extraout_RDX_02;
      }
    }
    uVar8 = aStack_210.value.content.size_;
    if ((local_218[0] == true) &&
       (uVar7 = aStack_210.value.content.ptr, aStack_210.value.content.ptr != (char *)0x0)) {
      aStack_210.value.content.ptr = (char *)0;
      aStack_210.value.content.size_ = 0;
      (**(aStack_210.value.content.disposer)->_vptr_ArrayDisposer)
                (aStack_210.value.content.disposer,uVar7,1,uVar8,uVar8,0);
      pDVar9 = extraout_RDX_03;
    }
    sVar5 = local_258.parts.size_;
    pSVar4 = local_258.parts.ptr;
    if (local_258.parts.ptr != (String *)0x0) {
      local_258.parts.ptr = (String *)0x0;
      local_258.parts.size_ = 0;
      (**(local_258.parts.disposer)->_vptr_ArrayDisposer)
                (local_258.parts.disposer,pSVar4,0x18,sVar5,sVar5,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
      pDVar9 = extraout_RDX_04;
    }
  }
  else {
    path.content.size_ = in_RCX;
    path.content.ptr = (char *)(in_RCX - 1);
    local_1f0 = this;
    kj::Path::parse((Path *)local_218,(Path *)(pathText.content.ptr + 1),path);
    pp_Var1 = pRVar11[6].super_FsNode._vptr_FsNode;
    pDVar9 = extraout_RDX;
    if (pp_Var1 != (_func_int **)0x0) {
      pp_Var2 = pRVar11[5].super_FsNode._vptr_FsNode;
      lVar10 = 0;
      do {
        params_1 = *(Path **)((long)pp_Var2 + lVar10);
        (*(code *)(params_1->parts).ptr[3].content.size_)
                  (&local_238,params_1,local_218,aStack_210.value.content.ptr);
        local_258.parts.ptr = (String *)local_238.disposer;
        local_258.parts.size_ = (size_t)local_238.ptr;
        if (local_238.ptr != (ReadableFile *)0x0) {
          OVar12 = kj::
                   heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::None_const&>
                             ((ReadableDirectory *)&local_238,params_1,
                              (ArrayPtr<const_kj::ReadableDirectory_*const> *)local_218,
                              (Own<const_kj::ReadableFile,_std::nullptr_t> *)(pRVar11 + 5),
                              (None *)&local_258);
          this = local_1f0;
          sVar5 = local_258.parts.size_;
          pDVar9 = OVar12.ptr;
          *(undefined4 *)&(local_1f0->super_SchemaFile)._vptr_SchemaFile = local_238.disposer._0_4_;
          *(undefined4 *)((long)&(local_1f0->super_SchemaFile)._vptr_SchemaFile + 4) =
               local_238.disposer._4_4_;
          *(undefined4 *)&local_1f0->baseDir = local_238.ptr._0_4_;
          *(undefined4 *)((long)&local_1f0->baseDir + 4) = local_238.ptr._4_4_;
          if ((ReadableFile *)local_258.parts.size_ != (ReadableFile *)0x0) {
            local_258.parts.size_ = 0;
            (*(code *)(((String *)((local_258.parts.ptr)->content).ptr)->content).ptr)
                      (local_258.parts.ptr,
                       ((FsNode *)sVar5)->_vptr_FsNode[-2] + (long)&((FsNode *)sVar5)->_vptr_FsNode)
            ;
            pDVar9 = extraout_RDX_05;
          }
          goto LAB_003a6e2b;
        }
        lVar10 = lVar10 + 8;
        pDVar9 = extraout_RDX_00;
      } while ((long)pp_Var1 << 3 != lVar10);
    }
    (local_1f0->super_SchemaFile)._vptr_SchemaFile = (_func_int **)0x0;
    local_1f0->baseDir = (ReadableDirectory *)0x0;
    this = local_1f0;
LAB_003a6e2b:
    auVar6 = local_218;
    if (local_218 != (undefined1  [8])0x0) {
      uVar8 = aStack_210.value.content.ptr;
      _local_218 = (ArrayPtr<const_kj::String>)ZEXT816(0);
      (***(_func_int ***)aStack_210.value.content.size_)
                (aStack_210.value.content.size_,auVar6,0x18,uVar8,uVar8,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
      pDVar9 = extraout_RDX_06;
    }
  }
  MVar13.ptr.ptr = &pDVar9->super_SchemaFile;
  MVar13.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_>)MVar13.ptr;
}

Assistant:

kj::Maybe<kj::Own<SchemaFile>> import(kj::StringPtr target) const override {
    if (target.startsWith("/")) {
      auto parsed = kj::Path::parse(target.slice(1));
      for (auto candidate: importPath) {
        KJ_IF_SOME(newFile, candidate->tryOpenFile(parsed)) {
          return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
              *candidate, kj::mv(parsed), importPath, kj::mv(newFile), kj::none));
        }
      }
      return kj::none;
    } else {
      auto parsed = path.parent().eval(target);

      kj::Maybe<kj::String> displayNameOverride;
      if (displayNameOverridden) {
        // Try to create a consistent display name override for the imported file. This is for
        // backwards-compatibility only -- display names are only overridden when using the
        // deprecated parseDiskFile() interface.
        kj::runCatchingExceptions([&]() {
          displayNameOverride = kj::Path::parse(displayName).parent().eval(target).toString();
        });
      }

      KJ_IF_SOME(newFile, baseDir.tryOpenFile(parsed)) {
        return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
            baseDir, kj::mv(parsed), importPath, kj::mv(newFile), kj::mv(displayNameOverride)));
      } else {
        return kj::none;
      }
    }